

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void cbtCollisionWorld::rayTestSingleInternal
               (cbtTransform *rayFromTrans,cbtTransform *rayToTrans,
               cbtCollisionObjectWrapper *collisionObjectWrap,RayResultCallback *resultCallback)

{
  float fVar1;
  cbtBvhTriangleMeshShape *this;
  cbtTransform *this_00;
  undefined8 *puVar2;
  cbtBvhTriangleMeshShape *this_01;
  cbtCollisionObject *pcVar3;
  undefined1 auVar4 [16];
  cbtScalar cVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int iVar10;
  undefined4 extraout_var;
  uint i;
  cbtBvhTriangleMeshShape *triangleMesh;
  cbtGjkConvexCast *pcVar11;
  cbtScalar cVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar19 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar25 [16];
  cbtVector3 cVar26;
  cbtVector3 cVar27;
  cbtVector3 rayAabbMaxLocal;
  cbtVector3 rayAabbMinLocal;
  cbtVector3 rayToLocalScaled;
  cbtVector3 rayToLocal_1;
  cbtSubsimplexConvexCast subSimplexConvexCaster;
  cbtGjkConvexCast gjkConvexCaster;
  LocalRayResult localRayResult;
  cbtTransform worldTocollisionObject;
  cbtVector3 local_220 [2];
  cbtScalar local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  cbtVoronoiSimplexSolver simplexSolver;
  cbtSphereShape pointShape;
  undefined1 auVar18 [56];
  undefined1 auVar24 [56];
  
  auVar24 = in_ZMM1._8_56_;
  auVar18 = ZEXT856(0);
  cbtSphereShape::cbtSphereShape(&pointShape,0.0);
  pointShape.super_cbtConvexInternalShape.m_collisionMargin = 0.0;
  this = (cbtBvhTriangleMeshShape *)collisionObjectWrap->m_shape;
  this_00 = collisionObjectWrap->m_worldTransform;
  iVar10 = (this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.
           m_shapeType;
  if (iVar10 < 0x18) {
    worldTocollisionObject.m_basis.m_el[0].m_floats._0_8_ = &PTR_DebugDraw_01193fa8;
    local_1f8 = 0;
    local_1f0 = 0x2000000000;
    local_1e8 = 0x38d1b717;
    local_200 = resultCallback->m_closestHitFraction;
    simplexSolver.m_equalVertexThreshold = 0.0001;
    simplexSolver.m_cachedBC.m_usedVertices._0_1_ = 0;
    cbtSubsimplexConvexCast::cbtSubsimplexConvexCast
              (&subSimplexConvexCaster,(cbtConvexShape *)&pointShape,(cbtConvexShape *)this,
               &simplexSolver);
    cbtGjkConvexCast::cbtGjkConvexCast
              (&gjkConvexCaster,(cbtConvexShape *)&pointShape,(cbtConvexShape *)this,&simplexSolver)
    ;
    pcVar11 = &gjkConvexCaster;
    if ((resultCallback->m_flags & 8) == 0) {
      pcVar11 = (cbtGjkConvexCast *)&subSimplexConvexCaster;
    }
    iVar10 = (*(((cbtSubsimplexConvexCast *)pcVar11)->super_cbtConvexCast)._vptr_cbtConvexCast[2])
                       (pcVar11,rayFromTrans,rayToTrans,this_00,this_00,&worldTocollisionObject);
    if ((char)iVar10 != '\0') {
      cVar12 = cbtVector3::length2(local_220);
      if ((0.0001 < cVar12) && (local_200 < resultCallback->m_closestHitFraction)) {
        cbtVector3::normalize(local_220);
        localRayResult.m_localShapeInfo = (LocalShapeInfo *)0x0;
        localRayResult.m_collisionObject = collisionObjectWrap->m_collisionObject;
        localRayResult.m_hitNormalLocal.m_floats[0] = local_220[0].m_floats[0];
        localRayResult.m_hitNormalLocal.m_floats[1] = local_220[0].m_floats[1];
        localRayResult.m_hitNormalLocal.m_floats[2] = local_220[0].m_floats[2];
        localRayResult.m_hitNormalLocal.m_floats[3] = local_220[0].m_floats[3];
        localRayResult.m_hitFraction = local_200;
        (*resultCallback->_vptr_RayResultCallback[3])(resultCallback,&localRayResult,1);
      }
    }
    cbtConvexCast::~cbtConvexCast(&gjkConvexCaster.super_cbtConvexCast);
    cbtConvexCast::~cbtConvexCast(&subSimplexConvexCaster.super_cbtConvexCast);
  }
  else if (iVar10 - 0x19U < 0xb) {
    cbtTransform::inverse(&worldTocollisionObject,this_00);
    cVar26 = cbtTransform::operator()(&worldTocollisionObject,&rayFromTrans->m_origin);
    auVar20._0_8_ = cVar26.m_floats._8_8_;
    auVar20._8_56_ = auVar24;
    auVar14._0_8_ = cVar26.m_floats._0_8_;
    auVar14._8_56_ = auVar18;
    subSimplexConvexCaster._0_16_ = vmovlhps_avx(auVar14._0_16_,auVar20._0_16_);
    auVar18 = ZEXT856(subSimplexConvexCaster.m_simplexSolver);
    cVar27 = cbtTransform::operator()(&worldTocollisionObject,&rayToTrans->m_origin);
    auVar21._0_8_ = cVar27.m_floats._8_8_;
    auVar21._8_56_ = auVar24;
    auVar15._0_8_ = cVar27.m_floats._0_8_;
    auVar15._8_56_ = auVar18;
    gjkConvexCaster._0_16_ = vmovlhps_avx(auVar15._0_16_,auVar21._0_16_);
    iVar10 = (this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.
             m_shapeType;
    if (iVar10 == 0x1a) {
      this_01 = *(cbtBvhTriangleMeshShape **)
                 (this->super_cbtTriangleMeshShape).m_localAabbMax.m_floats;
      iVar10 = (*(this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.
                 _vptr_cbtCollisionShape[7])(this);
      fVar1 = *(float *)((ulong *)CONCAT44(extraout_var,iVar10) + 1);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = *(ulong *)CONCAT44(extraout_var,iVar10);
      auVar4 = vdivps_avx(auVar14._0_16_,auVar19);
      auVar25._0_4_ = cVar26.m_floats[2] / fVar1;
      auVar25._4_12_ = auVar20._4_12_;
      localRayResult._0_16_ = vinsertps_avx(auVar4,auVar25,0x28);
      auVar4 = vdivps_avx(auVar15._0_16_,auVar19);
      auVar13._0_4_ = cVar27.m_floats[2] / fVar1;
      auVar13._4_12_ = auVar21._4_12_;
      rayToLocalScaled.m_floats = (cbtScalar  [4])vinsertps_avx(auVar4,auVar13,0x28);
      rayTestSingleInternal(cbtTransform_const&,cbtTransform_const&,cbtCollisionObjectWrapper_const*,cbtCollisionWorld
      ::RayResultCallback&)::BridgeTriangleRaycastCallback::
      BridgeTriangleRaycastCallback(cbtVector3_const&,cbtVector3_const&,cbtCollisionWorld::
      RayResultCallback__cbtCollisionObject_const__cbtConcaveShape_const__cbtTransform_const__
                (&simplexSolver,(cbtVector3 *)&localRayResult,&rayToLocalScaled,resultCallback,
                 collisionObjectWrap->m_collisionObject,(cbtConcaveShape *)this_01,this_00);
      simplexSolver.m_simplexVectorW[2].m_floats[2] = resultCallback->m_closestHitFraction;
      cbtBvhTriangleMeshShape::performRaycast
                (this_01,(cbtTriangleCallback *)&simplexSolver,(cbtVector3 *)&localRayResult,
                 &rayToLocalScaled);
    }
    else if (iVar10 == 0x19) {
      rayTestSingleInternal(cbtTransform_const&,cbtTransform_const&,cbtCollisionObjectWrapper_const*,cbtCollisionWorld
      ::RayResultCallback&)::BridgeTriangleRaycastCallback::
      BridgeTriangleRaycastCallback(cbtVector3_const&,cbtVector3_const&,cbtCollisionWorld::
      RayResultCallback__cbtCollisionObject_const__cbtConcaveShape_const__cbtTransform_const__
                (&simplexSolver,(cbtVector3 *)&subSimplexConvexCaster,(cbtVector3 *)&gjkConvexCaster
                 ,resultCallback,collisionObjectWrap->m_collisionObject,(cbtConcaveShape *)this,
                 this_00);
      simplexSolver.m_simplexVectorW[2].m_floats[2] = resultCallback->m_closestHitFraction;
      cbtBvhTriangleMeshShape::performRaycast
                (this,(cbtTriangleCallback *)&simplexSolver,(cbtVector3 *)&subSimplexConvexCaster,
                 (cbtVector3 *)&gjkConvexCaster);
    }
    else {
      cbtTransform::inverse((cbtTransform *)&localRayResult,this_00);
      cVar26 = cbtTransform::operator()((cbtTransform *)&localRayResult,&rayFromTrans->m_origin);
      auVar22._0_8_ = cVar26.m_floats._8_8_;
      auVar22._8_56_ = auVar24;
      auVar16._0_8_ = cVar26.m_floats._0_8_;
      auVar16._8_56_ = auVar18;
      rayToLocalScaled.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar16._0_16_,auVar22._0_16_);
      auVar18 = ZEXT856(rayToLocalScaled.m_floats._8_8_);
      cVar26 = cbtTransform::operator()((cbtTransform *)&localRayResult,&rayToTrans->m_origin);
      auVar23._0_8_ = cVar26.m_floats._8_8_;
      auVar23._8_56_ = auVar24;
      auVar17._0_8_ = cVar26.m_floats._0_8_;
      auVar17._8_56_ = auVar18;
      rayToLocal_1.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar17._0_16_,auVar23._0_16_);
      pcVar3 = collisionObjectWrap->m_collisionObject;
      cbtTriangleRaycastCallback::cbtTriangleRaycastCallback
                ((cbtTriangleRaycastCallback *)&simplexSolver,&rayToLocalScaled,&rayToLocal_1,
                 resultCallback->m_flags);
      cVar26 = rayToLocalScaled;
      simplexSolver._0_8_ = &PTR__cbtTriangleCallback_01193d80;
      simplexSolver.m_simplexVectorW[4].m_floats._4_8_ =
           *(undefined8 *)(this_00->m_basis).m_el[0].m_floats;
      simplexSolver.m_simplexVectorW[4].m_floats[3] = (this_00->m_basis).m_el[0].m_floats[2];
      simplexSolver.m_simplexPointsP[0].m_floats[0] = (this_00->m_basis).m_el[0].m_floats[3];
      simplexSolver.m_simplexPointsP[0].m_floats._4_8_ =
           *(undefined8 *)(this_00->m_basis).m_el[1].m_floats;
      simplexSolver.m_simplexPointsP._12_8_ =
           *(undefined8 *)((this_00->m_basis).m_el[1].m_floats + 2);
      simplexSolver.m_simplexPointsP[1].m_floats._4_8_ =
           *(undefined8 *)(this_00->m_basis).m_el[2].m_floats;
      simplexSolver.m_simplexPointsP._28_8_ =
           *(undefined8 *)((this_00->m_basis).m_el[2].m_floats + 2);
      simplexSolver.m_simplexPointsP[2].m_floats._4_8_ = *(undefined8 *)(this_00->m_origin).m_floats
      ;
      simplexSolver.m_simplexPointsP._44_8_ = *(undefined8 *)((this_00->m_origin).m_floats + 2);
      simplexSolver.m_simplexVectorW[2].m_floats[2] = resultCallback->m_closestHitFraction;
      rayAabbMinLocal.m_floats[0] = rayToLocalScaled.m_floats[0];
      rayAabbMinLocal.m_floats[1] = rayToLocalScaled.m_floats[1];
      uVar8 = rayAabbMinLocal.m_floats._0_8_;
      rayAabbMinLocal.m_floats[2] = rayToLocalScaled.m_floats[2];
      rayAabbMinLocal.m_floats[3] = rayToLocalScaled.m_floats[3];
      uVar9 = rayAabbMinLocal.m_floats._8_8_;
      rayAabbMinLocal.m_floats[0] = cVar26.m_floats[0];
      cVar12 = rayAabbMinLocal.m_floats[0];
      rayAabbMinLocal.m_floats[1] = cVar26.m_floats[1];
      cVar5 = rayAabbMinLocal.m_floats[1];
      if (rayToLocal_1.m_floats[0] < rayAabbMinLocal.m_floats[0]) {
        rayAabbMinLocal.m_floats[0] = rayToLocal_1.m_floats[0];
        uVar8 = rayAabbMinLocal.m_floats._0_8_;
      }
      rayAabbMinLocal.m_floats._0_8_ = uVar8;
      if (rayToLocal_1.m_floats[1] < rayAabbMinLocal.m_floats[1]) {
        rayAabbMinLocal.m_floats[1] = rayToLocal_1.m_floats[1];
      }
      rayAabbMinLocal.m_floats[2] = cVar26.m_floats[2];
      cVar6 = rayAabbMinLocal.m_floats[2];
      rayAabbMinLocal.m_floats[3] = cVar26.m_floats[3];
      cVar7 = rayAabbMinLocal.m_floats[3];
      if (rayToLocal_1.m_floats[2] < rayAabbMinLocal.m_floats[2]) {
        rayAabbMinLocal.m_floats[2] = rayToLocal_1.m_floats[2];
        uVar9 = rayAabbMinLocal.m_floats._8_8_;
      }
      rayAabbMinLocal.m_floats._8_8_ = uVar9;
      if (rayToLocal_1.m_floats[3] < rayAabbMinLocal.m_floats[3]) {
        rayAabbMinLocal.m_floats[3] = rayToLocal_1.m_floats[3];
      }
      rayAabbMaxLocal.m_floats[0] = rayToLocalScaled.m_floats[0];
      rayAabbMaxLocal.m_floats[1] = rayToLocalScaled.m_floats[1];
      rayAabbMaxLocal.m_floats[2] = rayToLocalScaled.m_floats[2];
      rayAabbMaxLocal.m_floats[3] = rayToLocalScaled.m_floats[3];
      if (cVar12 < rayToLocal_1.m_floats[0]) {
        rayAabbMaxLocal.m_floats[1] = cVar5;
        rayAabbMaxLocal.m_floats[0] = rayToLocal_1.m_floats[0];
      }
      if (rayAabbMaxLocal.m_floats[1] < rayToLocal_1.m_floats[1]) {
        rayAabbMaxLocal.m_floats[1] = rayToLocal_1.m_floats[1];
      }
      if (cVar6 < rayToLocal_1.m_floats[2]) {
        rayAabbMaxLocal.m_floats[3] = cVar7;
        rayAabbMaxLocal.m_floats[2] = rayToLocal_1.m_floats[2];
      }
      if (rayAabbMaxLocal.m_floats[3] < rayToLocal_1.m_floats[3]) {
        rayAabbMaxLocal.m_floats[3] = rayToLocal_1.m_floats[3];
      }
      rayToLocalScaled = cVar26;
      simplexSolver.m_simplexVectorW._44_8_ = resultCallback;
      simplexSolver.m_simplexVectorW[3].m_floats._4_8_ = pcVar3;
      simplexSolver.m_simplexVectorW._60_8_ = this;
      (*(this->super_cbtTriangleMeshShape).super_cbtConcaveShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0x10])(this,&simplexSolver,&rayAabbMinLocal,&rayAabbMaxLocal);
    }
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)&simplexSolver);
  }
  else if (iVar10 == 0x25) {
    puVar2 = *(undefined8 **)(this->m_pad + 6);
    worldTocollisionObject.m_basis.m_el[0].m_floats._8_8_ = collisionObjectWrap->m_collisionObject;
    worldTocollisionObject.m_basis.m_el[0].m_floats._0_8_ = &PTR__ICollide_01193dc8;
    worldTocollisionObject.m_basis.m_el[1].m_floats._0_8_ = this;
    worldTocollisionObject.m_basis.m_el[1].m_floats._8_8_ = this_00;
    worldTocollisionObject.m_basis.m_el[2].m_floats._0_8_ = rayFromTrans;
    worldTocollisionObject.m_basis.m_el[2].m_floats._8_8_ = rayToTrans;
    worldTocollisionObject.m_origin.m_floats._0_8_ = resultCallback;
    if (puVar2 == (undefined8 *)0x0) {
      cVar12 = (this->super_cbtTriangleMeshShape).m_localAabbMin.m_floats[1];
      for (i = 0; (~((int)cVar12 >> 0x1f) & (uint)cVar12) != i; i = i + 1) {
        rayTestSingleInternal::RayTester::ProcessLeaf((RayTester *)&worldTocollisionObject,i);
      }
    }
    else {
      cbtTransform::inverseTimes((cbtTransform *)&simplexSolver,this_00,rayFromTrans);
      localRayResult.m_localShapeInfo =
           (LocalShapeInfo *)simplexSolver.m_simplexVectorW[3].m_floats._4_8_;
      localRayResult.m_collisionObject = (cbtCollisionObject *)simplexSolver.m_simplexVectorW._44_8_
      ;
      cbtTransform::inverseTimes((cbtTransform *)&simplexSolver,this_00,rayToTrans);
      subSimplexConvexCaster.m_simplexSolver =
           (cbtVoronoiSimplexSolver *)simplexSolver.m_simplexVectorW[3].m_floats._4_8_;
      subSimplexConvexCaster.super_cbtConvexCast._vptr_cbtConvexCast =
           (_func_int **)simplexSolver.m_simplexVectorW._44_8_;
      cbtDbvt::rayTest((cbtDbvtNode *)*puVar2,(cbtVector3 *)&localRayResult,
                       (cbtVector3 *)&subSimplexConvexCaster,(ICollide *)&worldTocollisionObject);
    }
  }
  cbtConvexShape::~cbtConvexShape((cbtConvexShape *)&pointShape);
  return;
}

Assistant:

void cbtCollisionWorld::rayTestSingleInternal(const cbtTransform& rayFromTrans, const cbtTransform& rayToTrans,
											 const cbtCollisionObjectWrapper* collisionObjectWrap,
											 RayResultCallback& resultCallback)
{
	cbtSphereShape pointShape(cbtScalar(0.0));
	pointShape.setMargin(0.f);
	const cbtConvexShape* castShape = &pointShape;
	const cbtCollisionShape* collisionShape = collisionObjectWrap->getCollisionShape();
	const cbtTransform& colObjWorldTransform = collisionObjectWrap->getWorldTransform();

	if (collisionShape->isConvex())
	{
		//		BT_PROFILE("rayTestConvex");
		cbtConvexCast::CastResult castResult;
		castResult.m_fraction = resultCallback.m_closestHitFraction;

		cbtConvexShape* convexShape = (cbtConvexShape*)collisionShape;
		cbtVoronoiSimplexSolver simplexSolver;
		cbtSubsimplexConvexCast subSimplexConvexCaster(castShape, convexShape, &simplexSolver);

		cbtGjkConvexCast gjkConvexCaster(castShape, convexShape, &simplexSolver);

		//cbtContinuousConvexCollision convexCaster(castShape,convexShape,&simplexSolver,0);

		cbtConvexCast* convexCasterPtr = 0;
		//use kF_UseSubSimplexConvexCastRaytest by default
		if (resultCallback.m_flags & cbtTriangleRaycastCallback::kF_UseGjkConvexCastRaytest)
			convexCasterPtr = &gjkConvexCaster;
		else
			convexCasterPtr = &subSimplexConvexCaster;

		cbtConvexCast& convexCaster = *convexCasterPtr;

		if (convexCaster.calcTimeOfImpact(rayFromTrans, rayToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
		{
			//add hit
			if (castResult.m_normal.length2() > cbtScalar(0.0001))
			{
				if (castResult.m_fraction < resultCallback.m_closestHitFraction)
				{
					//todo: figure out what this is about. When is rayFromTest.getBasis() not identity?
#ifdef USE_SUBSIMPLEX_CONVEX_CAST
					//rotate normal into worldspace
					castResult.m_normal = rayFromTrans.getBasis() * castResult.m_normal;
#endif  //USE_SUBSIMPLEX_CONVEX_CAST

					castResult.m_normal.normalize();
					cbtCollisionWorld::LocalRayResult localRayResult(
						collisionObjectWrap->getCollisionObject(),
						0,
						castResult.m_normal,
						castResult.m_fraction);

					bool normalInWorldSpace = true;
					resultCallback.addSingleResult(localRayResult, normalInWorldSpace);
				}
			}
		}
	}
	else
	{
		if (collisionShape->isConcave())
		{
			//ConvexCast::CastResult
			struct BridgeTriangleRaycastCallback : public cbtTriangleRaycastCallback
			{
				cbtCollisionWorld::RayResultCallback* m_resultCallback;
				const cbtCollisionObject* m_collisionObject;
				const cbtConcaveShape* m_triangleMesh;

				cbtTransform m_colObjWorldTransform;

				BridgeTriangleRaycastCallback(const cbtVector3& from, const cbtVector3& to,
											  cbtCollisionWorld::RayResultCallback* resultCallback, const cbtCollisionObject* collisionObject, const cbtConcaveShape* triangleMesh, const cbtTransform& colObjWorldTransform) :  //@BP Mod
																																																							cbtTriangleRaycastCallback(from, to, resultCallback->m_flags),
																																																							m_resultCallback(resultCallback),
																																																							m_collisionObject(collisionObject),
																																																							m_triangleMesh(triangleMesh),
																																																							m_colObjWorldTransform(colObjWorldTransform)
				{
				}

				virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
				{
					cbtCollisionWorld::LocalShapeInfo shapeInfo;
					shapeInfo.m_shapePart = partId;
					shapeInfo.m_triangleIndex = triangleIndex;

					cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

					cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
															   &shapeInfo,
															   hitNormalWorld,
															   hitFraction);

					bool normalInWorldSpace = true;
					return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
				}
			};

			cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
			cbtVector3 rayFromLocal = worldTocollisionObject * rayFromTrans.getOrigin();
			cbtVector3 rayToLocal = worldTocollisionObject * rayToTrans.getOrigin();

			//			BT_PROFILE("rayTestConcave");
			if (collisionShape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				///optimized version for cbtBvhTriangleMeshShape
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)collisionShape;

				BridgeTriangleRaycastCallback rcb(rayFromLocal, rayToLocal, &resultCallback, collisionObjectWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;
				triangleMesh->performRaycast(&rcb, rayFromLocal, rayToLocal);
			}
			else if (collisionShape->getShapeType() == SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				///optimized version for cbtScaledBvhTriangleMeshShape
				cbtScaledBvhTriangleMeshShape* scaledTriangleMesh = (cbtScaledBvhTriangleMeshShape*)collisionShape;
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)scaledTriangleMesh->getChildShape();

				//scale the ray positions
				cbtVector3 scale = scaledTriangleMesh->getLocalScaling();
				cbtVector3 rayFromLocalScaled = rayFromLocal / scale;
				cbtVector3 rayToLocalScaled = rayToLocal / scale;

				//perform raycast in the underlying cbtBvhTriangleMeshShape
				BridgeTriangleRaycastCallback rcb(rayFromLocalScaled, rayToLocalScaled, &resultCallback, collisionObjectWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;
				triangleMesh->performRaycast(&rcb, rayFromLocalScaled, rayToLocalScaled);
			}
			else
			{
				//generic (slower) case
				cbtConcaveShape* concaveShape = (cbtConcaveShape*)collisionShape;

				cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();

				cbtVector3 rayFromLocal = worldTocollisionObject * rayFromTrans.getOrigin();
				cbtVector3 rayToLocal = worldTocollisionObject * rayToTrans.getOrigin();

				//ConvexCast::CastResult

				struct BridgeTriangleRaycastCallback : public cbtTriangleRaycastCallback
				{
					cbtCollisionWorld::RayResultCallback* m_resultCallback;
					const cbtCollisionObject* m_collisionObject;
					cbtConcaveShape* m_triangleMesh;

					cbtTransform m_colObjWorldTransform;

					BridgeTriangleRaycastCallback(const cbtVector3& from, const cbtVector3& to,
												  cbtCollisionWorld::RayResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtConcaveShape* triangleMesh, const cbtTransform& colObjWorldTransform) :  //@BP Mod
																																																						  cbtTriangleRaycastCallback(from, to, resultCallback->m_flags),
																																																						  m_resultCallback(resultCallback),
																																																						  m_collisionObject(collisionObject),
																																																						  m_triangleMesh(triangleMesh),
																																																						  m_colObjWorldTransform(colObjWorldTransform)
					{
					}

					virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;

						cbtVector3 hitNormalWorld = m_colObjWorldTransform.getBasis() * hitNormalLocal;

						cbtCollisionWorld::LocalRayResult rayResult(m_collisionObject,
																   &shapeInfo,
																   hitNormalWorld,
																   hitFraction);

						bool normalInWorldSpace = true;
						return m_resultCallback->addSingleResult(rayResult, normalInWorldSpace);
					}
				};

				BridgeTriangleRaycastCallback rcb(rayFromLocal, rayToLocal, &resultCallback, collisionObjectWrap->getCollisionObject(), concaveShape, colObjWorldTransform);
				rcb.m_hitFraction = resultCallback.m_closestHitFraction;

				cbtVector3 rayAabbMinLocal = rayFromLocal;
				rayAabbMinLocal.setMin(rayToLocal);
				cbtVector3 rayAabbMaxLocal = rayFromLocal;
				rayAabbMaxLocal.setMax(rayToLocal);

				concaveShape->processAllTriangles(&rcb, rayAabbMinLocal, rayAabbMaxLocal);
			}
		}
		else
		{
			//			BT_PROFILE("rayTestCompound");
			if (collisionShape->isCompound())
			{
				struct LocalInfoAdder2 : public RayResultCallback
				{
					RayResultCallback* m_userCallback;
					int m_i;

					LocalInfoAdder2(int i, RayResultCallback* user)
						: m_userCallback(user), m_i(i)
					{
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						m_flags = m_userCallback->m_flags;
					}
					virtual bool needsCollision(cbtBroadphaseProxy* p) const
					{
						return m_userCallback->needsCollision(p);
					}

					virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalRayResult& r, bool b)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = -1;
						shapeInfo.m_triangleIndex = m_i;
						if (r.m_localShapeInfo == NULL)
							r.m_localShapeInfo = &shapeInfo;

						const cbtScalar result = m_userCallback->addSingleResult(r, b);
						m_closestHitFraction = m_userCallback->m_closestHitFraction;
						return result;
					}
				};

				struct RayTester : cbtDbvt::ICollide
				{
					const cbtCollisionObject* m_collisionObject;
					const cbtCompoundShape* m_compoundShape;
					const cbtTransform& m_colObjWorldTransform;
					const cbtTransform& m_rayFromTrans;
					const cbtTransform& m_rayToTrans;
					RayResultCallback& m_resultCallback;

					RayTester(const cbtCollisionObject* collisionObject,
							  const cbtCompoundShape* compoundShape,
							  const cbtTransform& colObjWorldTransform,
							  const cbtTransform& rayFromTrans,
							  const cbtTransform& rayToTrans,
							  RayResultCallback& resultCallback) : m_collisionObject(collisionObject),
																   m_compoundShape(compoundShape),
																   m_colObjWorldTransform(colObjWorldTransform),
																   m_rayFromTrans(rayFromTrans),
																   m_rayToTrans(rayToTrans),
																   m_resultCallback(resultCallback)
					{
					}

					void ProcessLeaf(int i)
					{
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(i);
						const cbtTransform& childTrans = m_compoundShape->getChildTransform(i);
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						cbtCollisionObjectWrapper tmpOb(0, childCollisionShape, m_collisionObject, childWorldTrans, -1, i);
						// replace collision shape so that callback can determine the triangle

						LocalInfoAdder2 my_cb(i, &m_resultCallback);

						rayTestSingleInternal(
							m_rayFromTrans,
							m_rayToTrans,
							&tmpOb,
							my_cb);
					}

					void Process(const cbtDbvtNode* leaf)
					{
						ProcessLeaf(leaf->dataAsInt);
					}
				};

				const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(collisionShape);
				const cbtDbvt* dbvt = compoundShape->getDynamicAabbTree();

				RayTester rayCB(
					collisionObjectWrap->getCollisionObject(),
					compoundShape,
					colObjWorldTransform,
					rayFromTrans,
					rayToTrans,
					resultCallback);
#ifndef DISABLE_DBVT_COMPOUNDSHAPE_RAYCAST_ACCELERATION
				if (dbvt)
				{
					cbtVector3 localRayFrom = colObjWorldTransform.inverseTimes(rayFromTrans).getOrigin();
					cbtVector3 localRayTo = colObjWorldTransform.inverseTimes(rayToTrans).getOrigin();
					cbtDbvt::rayTest(dbvt->m_root, localRayFrom, localRayTo, rayCB);
				}
				else
#endif  //DISABLE_DBVT_COMPOUNDSHAPE_RAYCAST_ACCELERATION
				{
					for (int i = 0, n = compoundShape->getNumChildShapes(); i < n; ++i)
					{
						rayCB.ProcessLeaf(i);
					}
				}
			}
		}
	}
}